

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcDisassembler.c
# Opt level: O2

_Bool Sparc_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  cs_detail *__s;
  long lVar5;
  DecodeStatus DVar6;
  uint uVar7;
  ulong uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  void *Decoder;
  uint uVar13;
  uint64_t Address;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t Address_00;
  uint64_t extraout_RDX_01;
  uint64_t extraout_RDX_02;
  uint64_t extraout_RDX_03;
  uint64_t extraout_RDX_04;
  uint64_t extraout_RDX_05;
  uint64_t Address_01;
  uint64_t Address_02;
  uint64_t extraout_RDX_06;
  uint64_t extraout_RDX_07;
  uint64_t extraout_RDX_08;
  uint64_t Address_03;
  uint64_t extraout_RDX_09;
  uint64_t Address_04;
  uint64_t extraout_RDX_10;
  uint64_t extraout_RDX_11;
  uint64_t extraout_RDX_12;
  uint64_t Address_05;
  uint64_t extraout_RDX_13;
  uint64_t Address_06;
  uint64_t extraout_RDX_14;
  uint64_t Address_07;
  uint64_t extraout_RDX_15;
  uint64_t extraout_RDX_16;
  uint64_t extraout_RDX_17;
  uint64_t extraout_RDX_18;
  uint64_t Address_08;
  uint64_t Address_09;
  uint64_t extraout_RDX_19;
  uint64_t extraout_RDX_20;
  uint64_t Address_10;
  uint64_t extraout_RDX_21;
  uint64_t extraout_RDX_22;
  uint64_t extraout_RDX_23;
  uint64_t extraout_RDX_24;
  uint64_t extraout_RDX_25;
  uint64_t extraout_RDX_26;
  uint64_t extraout_RDX_27;
  uint64_t extraout_RDX_28;
  uint64_t Address_11;
  uint64_t extraout_RDX_29;
  uint64_t Address_12;
  uint64_t extraout_RDX_30;
  uint64_t Address_13;
  uint64_t extraout_RDX_31;
  uint64_t Address_14;
  uint64_t Address_15;
  uint64_t extraout_RDX_32;
  uint64_t extraout_RDX_33;
  uint64_t Address_16;
  uint64_t extraout_RDX_34;
  uint64_t Address_17;
  uint64_t extraout_RDX_35;
  uint64_t extraout_RDX_36;
  uint64_t extraout_RDX_37;
  uint64_t extraout_RDX_38;
  uint64_t extraout_RDX_39;
  uint64_t extraout_RDX_40;
  uint64_t extraout_RDX_41;
  uint64_t Address_18;
  uint64_t Address_19;
  uint64_t extraout_RDX_42;
  uint uVar14;
  uint uVar15;
  _Bool isLoad;
  code *DecodeRD;
  uint uVar16;
  uint insn;
  uint uVar17;
  uint local_4c;
  uint64_t local_48;
  uint local_3c;
  uint16_t *local_38;
  
  if (code_len < 4) {
    return false;
  }
  bVar1 = *code;
  bVar2 = code[2];
  bVar3 = code[3];
  uVar14 = (uint)bVar2 << 8;
  local_3c = (uint)code[1];
  uVar15 = (uint)code[1] << 0x10;
  uVar13 = uVar15 | uVar14;
  __s = MI->flat_insn->detail;
  local_48 = address;
  local_38 = size;
  if (__s != (cs_detail *)0x0) {
    memset(__s,0,0x5f8);
  }
  uVar7 = (uint)bVar3;
  insn = (uint)bVar1 << 0x18 | uVar13 | uVar7;
  uVar16 = 0;
  puVar12 = DecoderTableSparc32;
LAB_001a3c54:
  puVar11 = puVar12;
  switch(*puVar11) {
  case '\x01':
    bVar3 = puVar11[2];
    local_4c = (uint)bVar3;
    uVar16 = ~(-1 << (bVar3 & 0x1f)) << (puVar11[1] & 0x1f);
    if (bVar3 == 0x20) {
      uVar16 = 0xffffffff;
    }
    uVar16 = (uVar16 & insn) >> (puVar11[1] & 0x1f);
    puVar12 = puVar11 + 3;
    goto LAB_001a3c54;
  case '\x02':
    uVar9 = decodeULEB128(puVar11 + 1,&local_4c);
    puVar12 = puVar11 + (ulong)local_4c + 3;
    if (uVar16 == (uint)uVar9) goto LAB_001a3c54;
    lVar5 = (ulong)local_4c + 1;
    break;
  case '\x03':
    bVar3 = puVar11[1];
    bVar4 = puVar11[2];
    local_4c = (uint)bVar4;
    uVar17 = ~(-1 << (bVar4 & 0x1f)) << (bVar3 & 0x1f);
    if (bVar4 == 0x20) {
      uVar17 = 0xffffffff;
    }
    uVar9 = decodeULEB128(puVar11 + 3,&local_4c);
    puVar12 = puVar11 + (ulong)local_4c + 5;
    if ((uVar17 & insn) >> (bVar3 & 0x1f) == (uint)uVar9) goto LAB_001a3c54;
    lVar5 = (ulong)local_4c + 3;
    break;
  case '\x04':
    decodeULEB128(puVar11 + 1,&local_4c);
    puVar12 = puVar11 + (ulong)local_4c + 3;
    goto LAB_001a3c54;
  case '\x05':
    goto switchD_001a3c6c_caseD_5;
  case '\x06':
    goto switchD_001a3c6c_caseD_6;
  default:
    goto LAB_001a48ed;
  }
  puVar12 = puVar12 + *(ushort *)(puVar11 + lVar5);
  goto LAB_001a3c54;
switchD_001a3c6c_caseD_6:
  decodeULEB128(puVar11 + 1,&local_4c);
  uVar8 = (ulong)local_4c;
  decodeULEB128(puVar11 + uVar8 + 1,&local_4c);
  puVar12 = puVar11 + uVar8 + 1 + local_4c;
  goto LAB_001a3c54;
switchD_001a3dbe_caseD_10:
  uVar7 = (int)(insn << 0x13) >> 0x13;
  goto LAB_001a4763;
switchD_001a3c6c_caseD_5:
  uVar9 = decodeULEB128(puVar11 + 1,&local_4c);
  uVar10 = decodeULEB128(puVar11 + (ulong)local_4c + 1,&local_4c);
  MCInst_setOpcode(MI,(uint)uVar9);
  uVar16 = (int)uVar10 - 1;
  if (0x45 < uVar16) {
    uVar7 = uVar15 & 0x3fffff | uVar14 | uVar7;
    goto LAB_001a4763;
  }
  Decoder = (void *)((long)&switchD_001a3dbe::switchdataD_0024a938 +
                    (long)(int)(&switchD_001a3dbe::switchdataD_0024a938)[uVar16]);
  uVar9 = Address;
  switch((int)uVar10) {
  case 1:
    uVar8 = (ulong)(uVar15 & 0x7ffff | uVar14 | uVar7);
    goto LAB_001a468a;
  case 2:
    uVar8 = (ulong)(uVar15 & 0x3fffff | uVar14 | uVar7);
    goto LAB_001a468a;
  case 3:
    DVar6 = DecodeI64RegsRegisterClass(MI,uVar13 >> 0xe & 0x1f,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    uVar7 = (local_3c & 0x30) << 10 | uVar14 & 0x3fff | uVar7;
    break;
  case 4:
    goto switchD_001a3dbe_caseD_4;
  case 5:
    DVar6 = DecodeIntRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    uVar7 = uVar15 & 0x3fffff | uVar14 | uVar7;
    break;
  case 6:
    MCOperand_CreateImm0(MI,(ulong)(uVar15 & 0x7ffff | uVar14 | uVar7));
    MCOperand_CreateImm0(MI,(ulong)(bVar1 >> 1 & 0xf));
    DVar6 = DecodeFCCRegsRegisterClass(MI,local_3c >> 4 & 3,Address_09,Decoder);
    goto LAB_001a485d;
  case 7:
    uVar7 = insn << 2;
    break;
  case 8:
    DVar6 = DecodeIntRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_23;
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
  case 0xc:
    uVar13 = uVar13 >> 0xe;
LAB_001a4444:
    DVar6 = DecodeIntRegsRegisterClass(MI,uVar13 & 0x1f,uVar9,Decoder);
    uVar9 = extraout_RDX_24;
LAB_001a4449:
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    uVar14 = uVar7 & 0x1f;
LAB_001a445d:
    DVar6 = DecodeIntRegsRegisterClass(MI,uVar14,uVar9,Decoder);
    goto LAB_001a485d;
  case 9:
    DVar6 = DecodeIntRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_12;
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
  case 0xd:
    DVar6 = DecodeIntRegsRegisterClass(MI,uVar13 >> 0xe & 0x1f,uVar9,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    goto switchD_001a3dbe_caseD_10;
  case 10:
    DVar6 = DecodeI64RegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    uVar13 = uVar13 >> 0xe;
    uVar9 = extraout_RDX_19;
    goto LAB_001a4347;
  case 0xb:
    DVar6 = DecodeIntRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeIntRegsRegisterClass(MI,uVar13 >> 0xe & 0x1f,Address_04,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    uVar7 = uVar14 & 0x1fff | uVar7;
    break;
  case 0xe:
    DVar6 = DecodeI64RegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeI64RegsRegisterClass(MI,uVar13 >> 0xe & 0x1f,Address_07,Decoder);
    uVar9 = extraout_RDX_15;
    goto LAB_001a4449;
  case 0xf:
    DVar6 = DecodeI64RegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeI64RegsRegisterClass(MI,uVar13 >> 0xe & 0x1f,Address_03,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    uVar7 = uVar7 & 0x3f;
    break;
  case 0x10:
    goto switchD_001a3dbe_caseD_10;
  case 0x11:
    uVar15 = bVar1 >> 1 & 0x1f;
    DVar6 = DecodeIntRegsRegisterClass(MI,uVar15,Address,Decoder);
    uVar9 = extraout_RDX_17;
    goto LAB_001a439d;
  case 0x12:
    uVar15 = bVar1 >> 1 & 0x1f;
    DVar6 = DecodeIntRegsRegisterClass(MI,uVar15,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeFCCRegsRegisterClass(MI,bVar2 >> 3 & 3,Address_10,Decoder);
    uVar9 = extraout_RDX_21;
LAB_001a439d:
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeIntRegsRegisterClass(MI,uVar7 & 0x1f,uVar9,Decoder);
    uVar9 = extraout_RDX_22;
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
LAB_001a45b1:
    DVar6 = DecodeIntRegsRegisterClass(MI,uVar15,uVar9,Decoder);
LAB_001a474c:
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    uVar7 = uVar13 >> 0xe & 0xf;
    break;
  case 0x13:
    uVar15 = bVar1 >> 1 & 0x1f;
    DVar6 = DecodeIntRegsRegisterClass(MI,uVar15,Address,Decoder);
    goto LAB_001a458b;
  case 0x14:
    uVar15 = bVar1 >> 1 & 0x1f;
    DVar6 = DecodeIntRegsRegisterClass(MI,uVar15,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeFCCRegsRegisterClass(MI,bVar2 >> 3 & 3,Address_08,Decoder);
LAB_001a458b:
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    MCOperand_CreateImm0(MI,(ulong)(uVar14 & 0x7ff | uVar7));
    uVar9 = extraout_RDX_30;
    goto LAB_001a45b1;
  case 0x15:
    uVar13 = (uint)(bVar1 >> 1);
    goto LAB_001a4444;
  case 0x16:
    DVar6 = DecodeI64RegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeI64RegsRegisterClass(MI,uVar13 >> 0xe & 0x1f,Address_11,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    uVar7 = uVar14 & 0x3ff | uVar7;
    break;
  case 0x17:
    uVar13 = (uint)(bVar1 >> 1);
    uVar9 = Address;
    goto LAB_001a479d;
  case 0x18:
    uVar13 = (uint)(bVar1 >> 1);
    uVar9 = Address;
    goto LAB_001a44c1;
  case 0x19:
    uVar13 = (uint)(bVar1 >> 1);
    uVar9 = Address;
    goto LAB_001a483f;
  case 0x1a:
    DVar6 = DecodeFPRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_35;
    goto LAB_001a4786;
  case 0x1b:
    DVar6 = DecodeDFPRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_07;
    goto LAB_001a44aa;
  case 0x1c:
    DVar6 = DecodeQFPRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_32;
    goto LAB_001a4828;
  case 0x1d:
    DVar6 = DecodeDFPRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_33;
    goto LAB_001a4786;
  case 0x1e:
    DVar6 = DecodeQFPRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_25;
    goto LAB_001a44aa;
  case 0x1f:
    DVar6 = DecodeDFPRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_16;
    goto LAB_001a47a2;
  case 0x20:
    DVar6 = DecodeDFPRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_26;
    goto LAB_001a4844;
  case 0x21:
    DVar6 = DecodeFPRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_10;
    goto LAB_001a44c6;
  case 0x22:
    DVar6 = DecodeQFPRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_08;
    goto LAB_001a44c6;
  case 0x23:
    DVar6 = DecodeFPRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_04;
    goto LAB_001a4844;
  case 0x24:
    DVar6 = DecodeQFPRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_05;
    goto LAB_001a47a2;
  case 0x25:
    uVar14 = bVar1 >> 1 & 0x1f;
    DVar6 = DecodeFPRegsRegisterClass(MI,uVar14,Address,Decoder);
    uVar9 = extraout_RDX_02;
    goto LAB_001a471f;
  case 0x26:
    uVar14 = bVar1 >> 1 & 0x1f;
    DVar6 = DecodeFPRegsRegisterClass(MI,uVar14,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeFCCRegsRegisterClass(MI,bVar2 >> 3 & 3,Address_16,Decoder);
    uVar9 = extraout_RDX_34;
LAB_001a471f:
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeFPRegsRegisterClass(MI,uVar7 & 0x1f,uVar9,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeFPRegsRegisterClass(MI,uVar14,Address_17,Decoder);
    goto LAB_001a474c;
  case 0x27:
    uVar14 = bVar1 >> 1 & 0x1f;
    DVar6 = DecodeDFPRegsRegisterClass(MI,uVar14,Address,Decoder);
    uVar9 = extraout_RDX_29;
    goto LAB_001a4542;
  case 0x28:
    uVar14 = bVar1 >> 1 & 0x1f;
    DVar6 = DecodeDFPRegsRegisterClass(MI,uVar14,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeFCCRegsRegisterClass(MI,bVar2 >> 3 & 3,Address_06,Decoder);
    uVar9 = extraout_RDX_14;
LAB_001a4542:
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeDFPRegsRegisterClass(MI,uVar7 & 0x1f,uVar9,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeDFPRegsRegisterClass(MI,uVar14,Address_12,Decoder);
    goto LAB_001a474c;
  case 0x29:
    uVar14 = bVar1 >> 1 & 0x1f;
    DVar6 = DecodeQFPRegsRegisterClass(MI,uVar14,Address,Decoder);
    uVar9 = extraout_RDX_18;
    goto LAB_001a45ee;
  case 0x2a:
    uVar14 = bVar1 >> 1 & 0x1f;
    DVar6 = DecodeQFPRegsRegisterClass(MI,uVar14,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeFCCRegsRegisterClass(MI,bVar2 >> 3 & 3,Address_13,Decoder);
    uVar9 = extraout_RDX_31;
LAB_001a45ee:
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeQFPRegsRegisterClass(MI,uVar7 & 0x1f,uVar9,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeQFPRegsRegisterClass(MI,uVar14,Address_14,Decoder);
    goto LAB_001a474c;
  case 0x2b:
    DVar6 = DecodeFPRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeI64RegsRegisterClass(MI,uVar13 >> 0xe & 0x1f,Address_00,Decoder);
    uVar9 = extraout_RDX_01;
    goto LAB_001a47a2;
  case 0x2c:
    DVar6 = DecodeFCCRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_09;
LAB_001a4786:
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    uVar13 = uVar13 >> 0xe;
LAB_001a479d:
    DVar6 = DecodeFPRegsRegisterClass(MI,uVar13 & 0x1f,uVar9,Decoder);
    uVar9 = extraout_RDX_36;
LAB_001a47a2:
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
LAB_001a47ae:
    uVar7 = uVar7 & 0x1f;
LAB_001a47b6:
    DVar6 = DecodeFPRegsRegisterClass(MI,uVar7,uVar9,Decoder);
    goto LAB_001a485d;
  case 0x2d:
    DVar6 = DecodeFCCRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_27;
    goto LAB_001a44aa;
  case 0x2e:
    DVar6 = DecodeFCCRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_39;
LAB_001a4828:
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    uVar13 = uVar13 >> 0xe;
LAB_001a483f:
    DVar6 = DecodeQFPRegsRegisterClass(MI,uVar13 & 0x1f,uVar9,Decoder);
    uVar9 = extraout_RDX_40;
LAB_001a4844:
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeQFPRegsRegisterClass(MI,uVar7 & 0x1f,uVar9,Decoder);
    goto LAB_001a485d;
  case 0x2f:
    uVar13 = (uint)(bVar1 >> 1);
    uVar9 = Address;
LAB_001a4347:
    DVar6 = DecodeI64RegsRegisterClass(MI,uVar13 & 0x1f,uVar9,Decoder);
    uVar9 = extraout_RDX_20;
LAB_001a47d4:
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
switchD_001a3dbe_caseD_30:
    uVar14 = uVar7 & 0x1f;
LAB_001a47e8:
    DVar6 = DecodeI64RegsRegisterClass(MI,uVar14,uVar9,Decoder);
    goto LAB_001a485d;
  case 0x30:
    goto switchD_001a3dbe_caseD_30;
  case 0x31:
    DVar6 = DecodeI64RegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_11;
LAB_001a44aa:
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    uVar13 = uVar13 >> 0xe;
LAB_001a44c1:
    DVar6 = DecodeDFPRegsRegisterClass(MI,uVar13 & 0x1f,uVar9,Decoder);
    uVar9 = extraout_RDX_28;
LAB_001a44c6:
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
LAB_001a44d2:
    uVar7 = uVar7 & 0x1f;
LAB_001a44da:
    DVar6 = DecodeDFPRegsRegisterClass(MI,uVar7,uVar9,Decoder);
    goto LAB_001a485d;
  case 0x32:
    uVar7 = bVar1 >> 1 & 0x1f;
    DVar6 = DecodeDFPRegsRegisterClass(MI,uVar7,Address,Decoder);
    uVar9 = extraout_RDX_13;
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    goto LAB_001a44da;
  case 0x33:
    uVar7 = bVar1 >> 1 & 0x1f;
    DVar6 = DecodeFPRegsRegisterClass(MI,uVar7,Address,Decoder);
    uVar9 = extraout_RDX_00;
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    goto LAB_001a47b6;
  case 0x34:
    DVar6 = DecodeDFPRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    uVar7 = uVar13 >> 0xe;
    uVar9 = extraout_RDX_41;
    goto LAB_001a44d2;
  case 0x35:
    DVar6 = DecodeFPRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    uVar7 = uVar13 >> 0xe;
    uVar9 = extraout_RDX_38;
    goto LAB_001a47ae;
  case 0x36:
    DVar6 = DecodeI64RegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_03;
    goto LAB_001a44c6;
  case 0x37:
    DVar6 = DecodeDFPRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX_37;
    goto LAB_001a47d4;
  default:
    DVar6 = DecodeIntRegsRegisterClass(MI,bVar1 >> 1 & 0x1f,Address,Decoder);
    uVar9 = extraout_RDX;
    if (DVar6 == MCDisassembler_Success) goto LAB_001a462f;
    goto LAB_001a485d;
  case 0x39:
    uVar9 = Address;
LAB_001a462f:
    DVar6 = DecodeIntRegsRegisterClass(MI,uVar13 >> 0xe & 0x1f,uVar9,Decoder);
    if (DVar6 == MCDisassembler_Success) {
      if ((bVar2 & 0x20) != 0) {
        uVar7 = (int)(insn << 0x13) >> 0x13 & (int)((uint)bVar2 << 0x1a) >> 0x1f;
        break;
      }
      DVar6 = DecodeIntRegsRegisterClass(MI,uVar7 & 0x1f,Address_15,(void *)(ulong)(uint)bVar2);
      if (DVar6 == MCDisassembler_Success) goto switchD_001a3dbe_caseD_4;
    }
    goto LAB_001a485d;
  case 0x3a:
    DVar6 = DecodeIntRegsRegisterClass(MI,uVar13 >> 0xe & 0x1f,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeIntRegsRegisterClass(MI,uVar7 & 0x1f,Address_05,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    uVar7 = bVar1 >> 1 & 0xf;
    break;
  case 0x3b:
    DVar6 = DecodeIntRegsRegisterClass(MI,uVar13 >> 0xe & 0x1f,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    uVar8 = (ulong)uVar7;
LAB_001a468a:
    MCOperand_CreateImm0(MI,uVar8);
    uVar7 = bVar1 >> 1 & 0xf;
    break;
  case 0x3c:
    DecodeRD = DecodeIntRegsRegisterClass;
    goto LAB_001a43d1;
  case 0x3d:
    DecodeRD = DecodeIntRegsRegisterClass;
    goto LAB_001a43f5;
  case 0x3f:
    DecodeRD = DecodeFPRegsRegisterClass;
    goto LAB_001a43d1;
  case 0x40:
    DecodeRD = DecodeQFPRegsRegisterClass;
    goto LAB_001a43d1;
  case 0x41:
    DecodeRD = DecodeDFPRegsRegisterClass;
LAB_001a43d1:
    isLoad = true;
LAB_001a440f:
    DVar6 = DecodeMem(MI,insn,local_48,info,isLoad,DecodeRD);
LAB_001a485d:
    if (DVar6 == MCDisassembler_Fail) {
LAB_001a48ed:
      return false;
    }
    goto switchD_001a3dbe_caseD_4;
  case 0x42:
    DecodeRD = DecodeFPRegsRegisterClass;
    goto LAB_001a43f5;
  case 0x43:
    DecodeRD = DecodeQFPRegsRegisterClass;
    goto LAB_001a43f5;
  case 0x44:
    DecodeRD = DecodeDFPRegsRegisterClass;
LAB_001a43f5:
    isLoad = false;
    goto LAB_001a440f;
  case 0x45:
    uVar14 = bVar1 >> 1 & 0x1f;
    DVar6 = DecodeIntRegsRegisterClass(MI,uVar14,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeIntRegsRegisterClass(MI,uVar13 >> 0xe & 0x1f,Address_18,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeIntRegsRegisterClass(MI,uVar7 & 0x1f,Address_19,Decoder);
    uVar9 = extraout_RDX_42;
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    goto LAB_001a445d;
  case 0x46:
    uVar14 = bVar1 >> 1 & 0x1f;
    DVar6 = DecodeI64RegsRegisterClass(MI,uVar14,Address,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeI64RegsRegisterClass(MI,uVar13 >> 0xe & 0x1f,Address_01,Decoder);
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    DVar6 = DecodeI64RegsRegisterClass(MI,uVar7 & 0x1f,Address_02,Decoder);
    uVar9 = extraout_RDX_06;
    if (DVar6 == MCDisassembler_Fail) {
      return false;
    }
    goto LAB_001a47e8;
  }
LAB_001a4763:
  MCOperand_CreateImm0(MI,(ulong)uVar7);
switchD_001a3dbe_caseD_4:
  *local_38 = 4;
  return true;
}

Assistant:

static DecodeStatus readInstruction32(const uint8_t *code, size_t len, uint32_t *Insn)
{
	uint8_t Bytes[4];

	if (len < 4)
		// not enough data
		return MCDisassembler_Fail;

	memcpy(Bytes, code, 4);

	// Encoded as a big-endian 32-bit word in the stream.
	*Insn = (Bytes[3] <<  0) |
		(Bytes[2] <<  8) |
		(Bytes[1] << 16) |
		(Bytes[0] << 24);

	return MCDisassembler_Success;
}